

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O0

exr_result_t exr_attr_chlist_destroy(exr_context_t ctxt,exr_attr_chlist_t *clist)

{
  int iVar1;
  long lVar2;
  int *in_RSI;
  long in_RDI;
  int i;
  exr_attr_chlist_entry_t *entries;
  int nc;
  exr_attr_chlist_t nil;
  _internal_exr_context *pctxt;
  int local_44;
  exr_attr_string_t *in_stack_ffffffffffffffd0;
  exr_context_t in_stack_ffffffffffffffd8;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else {
    if (in_RSI != (int *)0x0) {
      memset(&stack0xffffffffffffffd0,0,0x10);
      iVar1 = *in_RSI;
      lVar2 = *(long *)(in_RSI + 2);
      for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
        exr_attr_string_destroy(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      }
      if (lVar2 != 0) {
        (**(code **)(in_RDI + 0x60))(lVar2);
      }
      *(exr_attr_string_t **)in_RSI = in_stack_ffffffffffffffd0;
      *(exr_context_t *)(in_RSI + 2) = in_stack_ffffffffffffffd8;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_chlist_destroy (exr_context_t ctxt, exr_attr_chlist_t* clist)
{
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (clist)
    {
        exr_attr_chlist_t        nil = {0};
        int                      nc  = clist->num_channels;
        exr_attr_chlist_entry_t* entries =
            EXR_CONST_CAST (exr_attr_chlist_entry_t*, clist->entries);

        for (int i = 0; i < nc; ++i)
            exr_attr_string_destroy (ctxt, &(entries[i].name));
        if (entries) pctxt->free_fn (entries);
        *clist = nil;
    }
    return EXR_ERR_SUCCESS;
}